

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

void C_SearchForPullins(FExecList *exec,char *file,FCommandLine *argv)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  FString path;
  FString local_48;
  char *local_40;
  char *local_38;
  
  if (exec == (FExecList *)0x0) {
    __assert_fail("exec != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/c_dispatch.cpp"
                  ,0x632,"void C_SearchForPullins(FExecList *, const char *, FCommandLine &)");
  }
  if (file == (char *)0x0) {
    __assert_fail("file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/c_dispatch.cpp"
                  ,0x633,"void C_SearchForPullins(FExecList *, const char *, FCommandLine &)");
  }
  local_40 = file;
  pcVar5 = strrchr(file,0x2f);
  iVar3 = FCommandLine::argc(argv);
  if (1 < iVar3) {
    local_38 = pcVar5 + (1 - (long)local_40);
    iVar3 = 1;
    do {
      if (pcVar5 == (char *)0x0) {
LAB_004abf1e:
        pcVar6 = FCommandLine::operator[](argv,iVar3);
        FString::FString(&local_48,pcVar6);
        TArray<FString,_FString>::Grow(&exec->Pullins,1);
        FString::AttachToOther((exec->Pullins).Array + (exec->Pullins).Count,&local_48);
      }
      else {
        FString::FString(&local_48,local_40,(size_t)local_38);
        pcVar6 = FCommandLine::operator[](argv,iVar3);
        FString::operator+=(&local_48,pcVar6);
        bVar2 = FileExists(local_48.Chars);
        if (!bVar2) {
          FString::~FString(&local_48);
          goto LAB_004abf1e;
        }
        TArray<FString,_FString>::Grow(&exec->Pullins,1);
        FString::AttachToOther((exec->Pullins).Array + (exec->Pullins).Count,&local_48);
      }
      puVar1 = &(exec->Pullins).Count;
      *puVar1 = *puVar1 + 1;
      FString::~FString(&local_48);
      iVar3 = iVar3 + 1;
      iVar4 = FCommandLine::argc(argv);
    } while (iVar3 < iVar4);
  }
  return;
}

Assistant:

void C_SearchForPullins(FExecList *exec, const char *file, FCommandLine &argv)
{
	const char *lastSlash;

	assert(exec != NULL);
	assert(file != NULL);
#ifdef __unix__
	lastSlash = strrchr(file, '/');
#else
	const char *lastSlash1, *lastSlash2;

	lastSlash1 = strrchr(file, '/');
	lastSlash2 = strrchr(file, '\\');
	lastSlash = MAX(lastSlash1, lastSlash2);
#endif

	for (int i = 1; i < argv.argc(); ++i)
	{
		// Try looking for the wad in the same directory as the .cfg
		// before looking for it in the current directory.
		if (lastSlash != NULL)
		{
			FString path(file, (lastSlash - file) + 1);
			path += argv[i];
			if (FileExists(path))
			{
				exec->Pullins.Push(path);
				continue;
			}
		}
		exec->Pullins.Push(argv[i]);
	}
}